

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

void __thiscall
file<std::basic_ofstream<char,_std::char_traits<char>_>_>::~file
          (file<std::basic_ofstream<char,_std::char_traits<char>_>_> *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  (this->super_basic_ofstream<char,_std::char_traits<char>_>).
  super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = (_func_int **)0x11f858;
  *(undefined8 *)&(this->super_basic_ofstream<char,_std::char_traits<char>_>).field_0x118 = 0x11f880
  ;
  std::filebuf::~filebuf
            ((filebuf *)
             &(this->super_basic_ofstream<char,_std::char_traits<char>_>).
              super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
  puVar2 = *(undefined1 **)
            &(this->super_basic_ofstream<char,_std::char_traits<char>_>).
             super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8;
  puVar1 = &(this->super_basic_ofstream<char,_std::char_traits<char>_>).
            super_basic_ostream<char,_std::char_traits<char>_>.field_0x108;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  std::ios_base::~ios_base
            ((ios_base *)&(this->super_basic_ofstream<char,_std::char_traits<char>_>).field_0x118);
  operator_delete(this,0x220);
  return;
}

Assistant:

file(const std::string& name)  // non explicit
      : std::string{name}, TFStream{name} {}